

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Accuracy::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *this_00;
  Texture2D *pTVar2;
  PixelBufferAccess *access;
  RGBA local_4c;
  Vec4 local_48;
  uint local_38;
  uint local_34;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int numLevels;
  Texture2DMipmapCase *local_10;
  Texture2DMipmapCase *this_local;
  
  local_10 = this;
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  iVar1 = de::max<int>(this->m_width,this->m_height);
  iVar1 = ::deLog2Floor32(iVar1);
  step = iVar1 + 1;
  for (inc = 0; (int)inc < (int)step; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(int)(step - 1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_38 = rgb << 0x10 | color * 0x100;
    local_34 = local_38 | 0xff;
    local_38 = local_38 | 0xff0000ff;
    pTVar2 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar2,inc);
    pTVar2 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar2->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_4c,local_38);
    tcu::RGBA::toVec((RGBA *)&local_48);
    tcu::clear(access,&local_48);
  }
  return inc;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}